

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

CONCRETE_IO_HANDLE tlsio_openssl_create(void *io_create_parameters)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  XIO_HANDLE pXVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  void *io_interface_parameters;
  IO_INTERFACE_DESCRIPTION *underlying_io_interface;
  SOCKETIO_CONFIG socketio_config;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TLS_IO_INSTANCE *result;
  TLSIO_CONFIG *tls_io_config;
  void *io_create_parameters_local;
  
  if (io_create_parameters == (void *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_create",0x504,1,"NULL tls_io_config.");
    }
  }
  else {
    l = (LOGGER_LOG)malloc(0xd0);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_create",0x50b,1,"Failed allocating TLSIO instance.");
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s((char **)(l + 0xa8),*io_create_parameters);
      if (iVar1 == 0) {
        if (*(long *)((long)io_create_parameters + 0x10) == 0) {
          underlying_io_interface = *io_create_parameters;
          socketio_config.hostname._0_4_ = *(undefined4 *)((long)io_create_parameters + 8);
          socketio_config.port = 0;
          socketio_config._12_4_ = 0;
          io_interface_parameters = socketio_get_interface_description();
          l_3 = (LOGGER_LOG)&underlying_io_interface;
        }
        else {
          io_interface_parameters = *(void **)((long)io_create_parameters + 0x10);
          l_3 = *(LOGGER_LOG *)((long)io_create_parameters + 0x18);
        }
        if (io_interface_parameters == (void *)0x0) {
          free(*(void **)(l + 0xa8));
          free(l);
          l = (LOGGER_LOG)0x0;
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                      ,"tlsio_openssl_create",0x52d,1,
                      "Failed getting socket IO interface description.");
          }
        }
        else {
          *(long *)(l + 0x70) = 0;
          *(long *)(l + 0x78) = 0;
          *(long *)(l + 0x58) = 0;
          *(long *)(l + 0x60) = 0;
          *(long *)(l + 8) = 0;
          *(long *)(l + 0x28) = 0;
          *(long *)(l + 0x10) = 0;
          *(long *)(l + 0x30) = 0;
          *(long *)(l + 0x18) = 0;
          *(long *)(l + 0x38) = 0;
          *(long *)(l + 0x20) = 0;
          *(long *)(l + 0x40) = 0;
          *(long *)(l + 0x48) = 0;
          *(long *)(l + 0x50) = 0;
          *(long *)(l + 0x98) = 0;
          *(long *)(l + 0xa0) = 0;
          *(long *)(l + 0x80) = 0;
          *(long *)(l + 0x88) = 0;
          l[0xb8] = (code)0x0;
          *(long *)(l + 0xb0) = 0;
          *(long *)(l + 0xc0) = 0;
          *(undefined4 *)(l + 200) = 0;
          *(undefined4 *)(l + 0x90) = 0xc;
          pXVar3 = xio_create((IO_INTERFACE_DESCRIPTION *)io_interface_parameters,l_3);
          *(XIO_HANDLE *)l = pXVar3;
          if (*(long *)l == 0) {
            free(*(void **)(l + 0xa8));
            free(l);
            l = (LOGGER_LOG)0x0;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                        ,"tlsio_openssl_create",0x550,1,"Failed xio_create.");
            }
          }
          else {
            *(undefined4 *)(l + 0x68) = 0;
          }
        }
      }
      else {
        socketio_config.accepted_socket = xlogging_get_log_function();
        if ((LOGGER_LOG)socketio_config.accepted_socket != (LOGGER_LOG)0x0) {
          (*(code *)socketio_config.accepted_socket)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/tlsio_openssl.c"
                     ,"tlsio_openssl_create",0x50f,1,"Failed copying the target hostname.");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return l;
}

Assistant:

CONCRETE_IO_HANDLE tlsio_openssl_create(void* io_create_parameters)
{
    TLSIO_CONFIG* tls_io_config = io_create_parameters;
    TLS_IO_INSTANCE* result;

    if (tls_io_config == NULL)
    {
        result = NULL;
        LogError("NULL tls_io_config.");
    }
    else
    {
        result = malloc(sizeof(TLS_IO_INSTANCE));
        if (result == NULL)
        {
            LogError("Failed allocating TLSIO instance.");
        }
        else if (mallocAndStrcpy_s(&result->hostname, tls_io_config->hostname) != 0)
        {
            LogError("Failed copying the target hostname.");
            free(result);
            result = NULL;
        }
        else
        {
            SOCKETIO_CONFIG socketio_config;
            const IO_INTERFACE_DESCRIPTION* underlying_io_interface;
            void* io_interface_parameters;

            if (tls_io_config->underlying_io_interface != NULL)
            {
                underlying_io_interface = tls_io_config->underlying_io_interface;
                io_interface_parameters = tls_io_config->underlying_io_parameters;
            }
            else
            {
                socketio_config.hostname = tls_io_config->hostname;
                socketio_config.port = tls_io_config->port;
                socketio_config.accepted_socket = NULL;

                underlying_io_interface = socketio_get_interface_description();
                io_interface_parameters = &socketio_config;
            }

            if (underlying_io_interface == NULL)
            {
                free(result->hostname);
                free(result);
                result = NULL;
                LogError("Failed getting socket IO interface description.");
            }
            else
            {
                result->certificate = NULL;
                result->cipher_list = NULL;
                result->in_bio = NULL;
                result->out_bio = NULL;
                result->on_bytes_received = NULL;
                result->on_bytes_received_context = NULL;
                result->on_io_open_complete = NULL;
                result->on_io_open_complete_context = NULL;
                result->on_io_close_complete = NULL;
                result->on_io_close_complete_context = NULL;
                result->on_io_error = NULL;
                result->on_io_error_context = NULL;
                result->ssl = NULL;
                result->ssl_context = NULL;
                result->tls_validation_callback = NULL;
                result->tls_validation_callback_data = NULL;
                result->x509_certificate = NULL;
                result->x509_private_key = NULL;
                result->ignore_host_name_check = false;
                result->engine_id = NULL;
                result->engine = NULL;
                result->x509_private_key_type = KEY_TYPE_DEFAULT;

                result->tls_version = VERSION_1_2;

                result->underlying_io = xio_create(underlying_io_interface, io_interface_parameters);
                if (result->underlying_io == NULL)
                {
                    free(result->hostname);
                    free(result);
                    result = NULL;
                    LogError("Failed xio_create.");
                }
                else
                {
                    result->tlsio_state = TLSIO_STATE_NOT_OPEN;
                }
            }
        }
    }

    return result;
}